

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_measurement.cpp
# Opt level: O3

void __thiscall
PreciseMeasurement_conversions_Test::TestBody(PreciseMeasurement_conversions_Test *this)

{
  char *pcVar1;
  precise_unit ud4;
  precise_measurement d3;
  precise_measurement d1;
  undefined1 local_a0 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_98;
  precise_unit local_90;
  undefined1 local_80 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_78;
  AssertHelper local_70;
  undefined1 local_68 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_60;
  undefined8 uStack_58;
  precise_measurement local_50;
  precise_measurement local_38;
  
  local_50.value_ = (double)&DAT_4046800000000000;
  local_50.units_.multiplier_ = (double)0x3fd381d7dbf487fd;
  local_50.units_.base_units_ = (unit_data)0x1;
  local_50.units_.commodity_ = 0;
  local_38.value_ = 13.716000000000001;
  local_38.units_.multiplier_ = 1.0;
  local_38.units_.base_units_ = (unit_data)0x1;
  local_38.units_.commodity_ = 0;
  local_80 = (undefined1  [8])0x3ff0000000000000;
  local_78 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1;
  testing::internal::CmpHelperEQ<units::precise_unit,units::precise_unit>
            ((internal *)local_68,"d2.units()","precise::m",(precise_unit *)local_80,
             (precise_unit *)units::precise::m);
  if (local_68[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_80);
    if (local_60 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_60->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement.cpp"
               ,0x237,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_a0,(Message *)local_80);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_a0);
    if (local_80 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_80 + 8))();
    }
  }
  if (local_60 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_60,local_60);
  }
  local_68 = (undefined1  [8])
             units::convert<units::precise_unit,units::precise_unit>
                       (local_50.value_,&local_50.units_,(precise_unit *)units::precise::in);
  local_60 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3f9a027525460aa6
  ;
  uStack_58._0_4_ = (unit_data)0x1;
  uStack_58._4_4_ = 0;
  local_a0 = (undefined1  [8])&DAT_3f9a027525460aa6;
  local_98 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1;
  testing::internal::CmpHelperEQ<units::precise_unit,units::precise_unit>
            ((internal *)local_80,"d3.units()","precise::in",(precise_unit *)local_a0,
             (precise_unit *)units::precise::in);
  if (local_80[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_a0);
    if (local_78 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_78->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement.cpp"
               ,0x23a,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_90,(Message *)local_a0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_90);
    if (local_a0 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_a0 + 8))();
    }
  }
  if (local_78 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_78,local_78);
  }
  testing::internal::CmpHelperEQ<units::precise_measurement,units::precise_measurement>
            ((internal *)local_80,"d1","d2",&local_50,&local_38);
  if (local_80[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_a0);
    if (local_78 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_78->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement.cpp"
               ,0x23c,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_90,(Message *)local_a0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_90);
    if (local_a0 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_a0 + 8))();
    }
  }
  if (local_78 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_78,local_78);
  }
  testing::internal::CmpHelperEQ<units::precise_measurement,units::precise_measurement>
            ((internal *)local_80,"d2","d3",&local_38,(precise_measurement *)local_68);
  if (local_80[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_a0);
    if (local_78 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_78->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement.cpp"
               ,0x23d,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_90,(Message *)local_a0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_90);
    if (local_a0 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_a0 + 8))();
    }
  }
  if (local_78 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_78,local_78);
  }
  testing::internal::CmpHelperEQ<units::precise_measurement,units::precise_measurement>
            ((internal *)local_80,"d3","d1",(precise_measurement *)local_68,&local_50);
  if (local_80[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_a0);
    if (local_78 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_78->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement.cpp"
               ,0x23e,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_90,(Message *)local_a0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_90);
    if (local_a0 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_a0 + 8))();
    }
  }
  if (local_78 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_78,local_78);
  }
  testing::internal::CmpHelperEQ<units::precise_measurement,units::precise_measurement>
            ((internal *)local_80,"d1","d3",&local_50,(precise_measurement *)local_68);
  if (local_80[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_a0);
    if (local_78 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_78->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement.cpp"
               ,0x23f,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_90,(Message *)local_a0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_90);
    if (local_a0 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_a0 + 8))();
    }
  }
  if (local_78 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_78,local_78);
  }
  local_80 = (undefined1  [8])(local_50.units_.multiplier_ * local_50.value_);
  local_78 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             local_50.units_._8_8_;
  local_90.multiplier_ =
       units::convert<units::precise_unit,units::precise_unit>
                 (local_50.value_,&local_50.units_,(precise_unit *)local_80);
  local_70.data_ = (AssertHelperData *)&DAT_3ff0000000000000;
  testing::internal::CmpHelperEQ<double,double>
            ((internal *)local_a0,"d4.value()","1.0",&local_90.multiplier_,(double *)&local_70);
  if (local_a0[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_90);
    if (local_98 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_98->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement.cpp"
               ,0x243,pcVar1);
    testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_90);
    testing::internal::AssertHelper::~AssertHelper(&local_70);
    if ((long *)local_90.multiplier_ != (long *)0x0) {
      (**(code **)(*(long *)local_90.multiplier_ + 8))();
    }
  }
  if (local_98 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_98,local_98);
  }
  local_90.multiplier_ = (double)&DAT_3ff0000000000000;
  local_90.base_units_ = (unit_data)0x1;
  local_90.commodity_ = 0;
  testing::internal::CmpHelperEQ<units::precise_unit,units::precise_unit>
            ((internal *)local_a0,"d5.convert_to_base().units()","precise::m",&local_90,
             (precise_unit *)units::precise::m);
  if (local_a0[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_90);
    if (local_98 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_98->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement.cpp"
               ,0x247,pcVar1);
    testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_90);
    testing::internal::AssertHelper::~AssertHelper(&local_70);
    if ((long *)local_90.multiplier_ != (long *)0x0) {
      (**(code **)(*(long *)local_90.multiplier_ + 8))();
    }
  }
  if (local_98 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_98,local_98);
  }
  local_90.multiplier_ = (double)&DAT_3fed42c3c9eecbfc;
  local_90.base_units_ = (unit_data)0x1;
  local_90.commodity_ = 0;
  testing::internal::CmpHelperEQ<units::precise_unit,units::precise_unit>
            ((internal *)local_a0,"d5.as_unit()","precise::yd",&local_90,
             (precise_unit *)units::precise::yd);
  if (local_a0[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_90);
    if (local_98 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_98->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement.cpp"
               ,0x24d,pcVar1);
    testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_90);
    testing::internal::AssertHelper::~AssertHelper(&local_70);
    if ((long *)local_90.multiplier_ != (long *)0x0) {
      (**(code **)(*(long *)local_90.multiplier_ + 8))();
    }
  }
  if (local_98 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_98,local_98);
  }
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_a0,"quick_convert(1.0, d5.as_unit(), precise::yd)","1.0",
             1.0000000000000002,1.0);
  if (local_a0[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_90);
    if (local_98 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_98->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement.cpp"
               ,0x24e,pcVar1);
    testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_90);
    testing::internal::AssertHelper::~AssertHelper(&local_70);
    if ((long *)local_90.multiplier_ != (long *)0x0) {
      (**(code **)(*(long *)local_90.multiplier_ + 8))();
    }
  }
  if (local_98 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_98,local_98);
  }
  return;
}

Assistant:

TEST(PreciseMeasurement, conversions)
{
    auto d1 = 45.0 * precise::ft;
    auto d2 = d1.convert_to_base();
    EXPECT_EQ(d2.units(), precise::m);

    auto d3 = d1.convert_to(precise::in);
    EXPECT_EQ(d3.units(), precise::in);

    EXPECT_EQ(d1, d2);
    EXPECT_EQ(d2, d3);
    EXPECT_EQ(d3, d1);
    EXPECT_EQ(d1, d3);

    auto ud4 = d1.as_unit();
    auto d4 = d1.convert_to(ud4);
    EXPECT_EQ(d4.value(), 1.0);

    constexpr auto d5 = precise::ft * 3.0;
    // convert to base
    EXPECT_EQ(d5.convert_to_base().units(), precise::m);
    static_assert(
        (3.0 * precise::ft).convert_to_base().units().base_units() ==
            precise::m.base_units(),
        "constexpr convert_to_base not working");

    EXPECT_EQ(d5.as_unit(), precise::yd);
    EXPECT_DOUBLE_EQ(quick_convert(1.0, d5.as_unit(), precise::yd), 1.0);
    // static_assert(==1.0, "constexpr convert_to_base not working");
}